

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>
          (SOLHandler_Easy *this,VecReader<double> *rd)

{
  NLSolution *pNVar1;
  pointer pdVar2;
  double in_RAX;
  double local_28;
  
  pNVar1 = this->sol_;
  pdVar2 = (pNVar1->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pNVar1->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (pNVar1->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = pdVar2;
  }
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (&pNVar1->y_,
             (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons +
             (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  while (rd->n_ != 0) {
    pNVar1 = this->sol_;
    local_28 = VecReader<double>::ReadNext(rd);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&pNVar1->y_,&local_28);
  }
  return;
}

Assistant:

void OnDualSolution(VecReader& rd) {
    sol_.y_.clear();
    sol_.y_.reserve(header_.num_algebraic_cons
                    + header_.num_logical_cons);
    while (rd.Size())         // No permutation
      sol_.y_.push_back(rd.ReadNext());
  }